

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

void __thiscall QTextEdit::mouseMoveEvent(QTextEdit *this,QMouseEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  double dVar9;
  double extraout_XMM1_Qa;
  double dVar10;
  undefined8 local_48;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  *(byte *)(lVar1 + 800) = *(byte *)(lVar1 + 800) & 0xf7;
  dVar9 = (double)QEventPoint::position();
  dVar9 = (double)(((ulong)dVar9 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar9;
  bVar3 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  dVar10 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
  bVar4 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  local_48 = CONCAT44((int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar4 & (ulong)dVar10),
                      (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar3 & (ulong)dVar9));
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  LVar6 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 8));
  if (LVar6 == RightToLeft) {
    iVar7 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar8 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar7 = iVar7 - iVar8;
  }
  else {
    iVar7 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  }
  iVar8 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  local_40.yp = (qreal)iVar8;
  local_40.xp = (double)iVar7;
  QWidgetTextControl::processEvent(this_00,(QEvent *)e,&local_40,*(QWidget **)(lVar1 + 0x2b0));
  if (((byte)e[0x44] & 1) != 0) {
    iVar7 = QMouseEvent::source();
    if (iVar7 == 0) {
      lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
      local_40.yp = (qreal)CONCAT44(*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18),
                                    *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14));
      local_40.xp = 0.0;
      cVar5 = QRect::contains((QPoint *)&local_40,SUB81(&local_48,0));
      if (cVar5 == '\0') {
        if (*(int *)(lVar1 + 0x308) == 0) {
          QBasicTimer::start((int *)(lVar1 + 0x308),100000000,1,this);
        }
      }
      else {
        QBasicTimer::stop();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->inDrag = false; // paranoia
    const QPoint pos = e->position().toPoint();
    d->sendControlEvent(e);
    if (!(e->buttons() & Qt::LeftButton))
        return;
    if (e->source() == Qt::MouseEventNotSynthesized) {
        const QRect visible = d->viewport->rect();
        if (visible.contains(pos))
            d->autoScrollTimer.stop();
        else if (!d->autoScrollTimer.isActive())
            d->autoScrollTimer.start(100, this);
    }
}